

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::~ExceptionOr
          (ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> *this)

{
  long *plVar1;
  undefined8 *puVar2;
  
  if ((((this->value).ptr.isSet == true) && ((this->value).ptr.field_1.value.ptr.isSet == true)) &&
     (plVar1 = *(long **)((long)&(this->value).ptr.field_1 + 0x10), plVar1 != (long *)0x0)) {
    *(undefined8 *)((long)&(this->value).ptr.field_1 + 0x10) = 0;
    puVar2 = *(undefined8 **)((long)&(this->value).ptr.field_1 + 8);
    (**(code **)*puVar2)(puVar2,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr() = default;